

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# args.cc
# Opt level: O2

void __thiscall fasttext::Args::parseArgs(Args *this,int argc,char **argv)

{
  char *pcVar1;
  bool bVar2;
  int iVar3;
  ostream *poVar4;
  Args *this_00;
  string *this_01;
  long lVar5;
  double dVar6;
  allocator local_e1;
  Args *local_e0;
  string *local_d8;
  Args *local_d0;
  Args *local_c8;
  Args *local_c0;
  Args *local_b8;
  Args *local_b0;
  Args *local_a8;
  Args *local_a0;
  Args *local_98;
  string command;
  string local_70;
  string local_50;
  
  std::__cxx11::string::string((string *)&command,argv[1],(allocator *)&local_50);
  bVar2 = std::operator==(&command,"supervised");
  if (bVar2) {
    this->loss = softmax;
    this->model = sup;
    this->minCount = 1;
    this->lr = 0.1;
  }
  else {
    bVar2 = std::operator==(&command,"cbow");
    if (bVar2) {
      this->model = cbow;
    }
  }
  local_c8 = (Args *)&this->pretrainedVectors;
  local_d0 = (Args *)&this->label;
  local_d8 = (string *)&this->propsStr;
  local_c0 = (Args *)&this->ipaoutput;
  local_b8 = (Args *)&this->morphoutput;
  local_b0 = (Args *)&this->lemmaoutput;
  local_a8 = (Args *)&this->suboutput;
  local_a0 = (Args *)&this->output;
  local_98 = (Args *)&this->test;
  lVar5 = 2;
  local_e0 = this;
LAB_00115630:
  if (argc <= lVar5) {
    if (((local_e0->input)._M_string_length != 0) && ((local_e0->output)._M_string_length != 0)) {
      std::__cxx11::string::~string((string *)&command);
      return;
    }
    poVar4 = std::operator<<((ostream *)&std::cout,"Empty input or output path.");
    std::endl<char,std::char_traits<char>>(poVar4);
    printHelp(local_e0);
LAB_00115c39:
    exit(1);
  }
  pcVar1 = argv[lVar5];
  if (*pcVar1 != '-') {
    poVar4 = std::operator<<((ostream *)&std::cout,"Provided argument without a dash! Usage:");
    std::endl<char,std::char_traits<char>>(poVar4);
    printHelp(local_e0);
    goto LAB_00115c39;
  }
  if ((pcVar1[1] == 'h') && (pcVar1[2] == '\0')) {
    poVar4 = std::operator<<((ostream *)&std::cout,"Here is the help! Usage:");
    std::endl<char,std::char_traits<char>>(poVar4);
    printHelp(local_e0);
    goto LAB_00115c39;
  }
  iVar3 = strcmp(pcVar1,"-input");
  if (iVar3 == 0) {
    std::__cxx11::string::string((string *)&local_50,argv[lVar5 + 1],&local_e1);
    this_00 = local_e0;
  }
  else {
    iVar3 = strcmp(pcVar1,"-test");
    if (iVar3 == 0) {
      std::__cxx11::string::string((string *)&local_50,argv[lVar5 + 1],&local_e1);
      this_00 = local_98;
      goto LAB_0011595f;
    }
    iVar3 = strcmp(pcVar1,"-output");
    if (iVar3 == 0) {
      std::__cxx11::string::string((string *)&local_50,argv[lVar5 + 1],&local_e1);
      this_00 = local_a0;
      goto LAB_0011595f;
    }
    iVar3 = strcmp(pcVar1,"-suboutput");
    if (iVar3 == 0) {
      std::__cxx11::string::string((string *)&local_50,argv[lVar5 + 1],&local_e1);
      this_00 = local_a8;
      goto LAB_0011595f;
    }
    iVar3 = strcmp(pcVar1,"-lemmaoutput");
    if (iVar3 == 0) {
      std::__cxx11::string::string((string *)&local_50,argv[lVar5 + 1],&local_e1);
      this_00 = local_b0;
      goto LAB_0011595f;
    }
    iVar3 = strcmp(pcVar1,"-morphoutput");
    if (iVar3 == 0) {
      std::__cxx11::string::string((string *)&local_50,argv[lVar5 + 1],&local_e1);
      this_00 = local_b8;
      goto LAB_0011595f;
    }
    iVar3 = strcmp(pcVar1,"-ipaoutput");
    if (iVar3 == 0) {
      std::__cxx11::string::string((string *)&local_50,argv[lVar5 + 1],&local_e1);
      this_00 = local_c0;
      goto LAB_0011595f;
    }
    iVar3 = strcmp(pcVar1,"-props");
    if (iVar3 == 0) {
      std::__cxx11::string::string((string *)&local_50,argv[lVar5 + 1],&local_e1);
      std::__cxx11::string::operator=(local_d8,(string *)&local_50);
      std::__cxx11::string::~string((string *)&local_50);
      std::__cxx11::string::string((string *)&local_70,local_d8);
      initProps(local_e0,&local_70);
      this_01 = &local_70;
      goto LAB_0011596a;
    }
    iVar3 = strcmp(pcVar1,"-lr");
    if (iVar3 == 0) {
      dVar6 = atof(argv[lVar5 + 1]);
      local_e0->lr = dVar6;
      goto LAB_0011596f;
    }
    iVar3 = strcmp(pcVar1,"-lrUpdateRate");
    if (iVar3 == 0) {
      iVar3 = atoi(argv[lVar5 + 1]);
      local_e0->lrUpdateRate = iVar3;
      goto LAB_0011596f;
    }
    iVar3 = strcmp(pcVar1,"-dim");
    if (iVar3 == 0) {
      iVar3 = atoi(argv[lVar5 + 1]);
      local_e0->dim = iVar3;
      goto LAB_0011596f;
    }
    iVar3 = strcmp(pcVar1,"-ws");
    if (iVar3 == 0) {
      iVar3 = atoi(argv[lVar5 + 1]);
      local_e0->ws = iVar3;
      goto LAB_0011596f;
    }
    iVar3 = strcmp(pcVar1,"-epoch");
    if (iVar3 == 0) {
      iVar3 = atoi(argv[lVar5 + 1]);
      local_e0->epoch = iVar3;
      goto LAB_0011596f;
    }
    iVar3 = strcmp(pcVar1,"-minCount");
    if (iVar3 == 0) {
      iVar3 = atoi(argv[lVar5 + 1]);
      local_e0->minCount = iVar3;
      goto LAB_0011596f;
    }
    iVar3 = strcmp(pcVar1,"-neg");
    if (iVar3 == 0) {
      iVar3 = atoi(argv[lVar5 + 1]);
      local_e0->neg = iVar3;
      goto LAB_0011596f;
    }
    iVar3 = strcmp(pcVar1,"-minn");
    if (iVar3 == 0) {
      iVar3 = atoi(argv[lVar5 + 1]);
      local_e0->minn = iVar3;
      goto LAB_0011596f;
    }
    iVar3 = strcmp(pcVar1,"-maxn");
    if (iVar3 == 0) {
      iVar3 = atoi(argv[lVar5 + 1]);
      local_e0->maxn = iVar3;
      goto LAB_0011596f;
    }
    iVar3 = strcmp(pcVar1,"-wordNgrams");
    if (iVar3 == 0) {
      iVar3 = atoi(argv[lVar5 + 1]);
      local_e0->wordNgrams = iVar3;
      goto LAB_0011596f;
    }
    iVar3 = strcmp(pcVar1,"-loss");
    if (iVar3 == 0) {
      pcVar1 = argv[lVar5 + 1];
      if (*pcVar1 == 'n') {
        if ((pcVar1[1] != 's') || (pcVar1[2] != '\0')) goto LAB_00115b30;
        local_e0->loss = ns;
      }
      else if (((*pcVar1 == 'h') && (pcVar1[1] == 's')) && (pcVar1[2] == '\0')) {
        local_e0->loss = hs;
      }
      else {
LAB_00115b30:
        iVar3 = strcmp(pcVar1,"softmax");
        if (iVar3 != 0) {
          poVar4 = std::operator<<((ostream *)&std::cout,"Unknown loss: ");
          poVar4 = std::operator<<(poVar4,argv[lVar5 + 1]);
          std::endl<char,std::char_traits<char>>(poVar4);
          printHelp(local_e0);
          goto LAB_00115c39;
        }
        local_e0->loss = softmax;
      }
      goto LAB_0011596f;
    }
    iVar3 = strcmp(pcVar1,"-bucket");
    if (iVar3 == 0) {
      iVar3 = atoi(argv[lVar5 + 1]);
      local_e0->bucket = iVar3;
      goto LAB_0011596f;
    }
    iVar3 = strcmp(pcVar1,"-thread");
    if (iVar3 == 0) {
      iVar3 = atoi(argv[lVar5 + 1]);
      local_e0->thread = iVar3;
      goto LAB_0011596f;
    }
    if ((pcVar1[1] == 't') && (pcVar1[2] == '\0')) {
      dVar6 = atof(argv[lVar5 + 1]);
      local_e0->t = dVar6;
      goto LAB_0011596f;
    }
    iVar3 = strcmp(pcVar1,"-label");
    if (iVar3 != 0) {
      iVar3 = strcmp(pcVar1,"-verbose");
      if (iVar3 == 0) {
        iVar3 = atoi(argv[lVar5 + 1]);
        local_e0->verbose = iVar3;
        goto LAB_0011596f;
      }
      iVar3 = strcmp(pcVar1,"-pretrainedVectors");
      if (iVar3 == 0) {
        std::__cxx11::string::string((string *)&local_50,argv[lVar5 + 1],&local_e1);
        this_00 = local_c8;
        goto LAB_0011595f;
      }
      poVar4 = std::operator<<((ostream *)&std::cout,"Unknown argument: ");
      poVar4 = std::operator<<(poVar4,argv[lVar5]);
      std::endl<char,std::char_traits<char>>(poVar4);
      printHelp(local_e0);
      goto LAB_00115c39;
    }
    std::__cxx11::string::string((string *)&local_50,argv[lVar5 + 1],&local_e1);
    this_00 = local_d0;
  }
LAB_0011595f:
  std::__cxx11::string::operator=((string *)this_00,(string *)&local_50);
  this_01 = &local_50;
LAB_0011596a:
  std::__cxx11::string::~string((string *)this_01);
LAB_0011596f:
  lVar5 = lVar5 + 2;
  goto LAB_00115630;
}

Assistant:

void Args::parseArgs(int argc, char** argv) {
  std::string command(argv[1]);
  if (command == "supervised") {
    model = model_name::sup;
    loss = loss_name::softmax;
    minCount = 1;
    lr = 0.1;
  } else if (command == "cbow") {
    model = model_name::cbow;
  }
  int ai = 2;
  while (ai < argc) {
    if (argv[ai][0] != '-') {
      std::cout << "Provided argument without a dash! Usage:" << std::endl;
      printHelp();
      exit(EXIT_FAILURE);
    }
    if (strcmp(argv[ai], "-h") == 0) {
      std::cout << "Here is the help! Usage:" << std::endl;
      printHelp();
      exit(EXIT_FAILURE);
    } else if (strcmp(argv[ai], "-input") == 0) {
      input = std::string(argv[ai + 1]); 
	} else if (strcmp(argv[ai], "-test") == 0) {
      test = std::string(argv[ai + 1]);
    } else if (strcmp(argv[ai], "-output") == 0) {
      output = std::string(argv[ai + 1]);
    } else if (strcmp(argv[ai], "-suboutput") == 0) {
      suboutput = std::string(argv[ai + 1]);
    } else if (strcmp(argv[ai], "-lemmaoutput") == 0) {
      lemmaoutput = std::string(argv[ai + 1]);
    } else if (strcmp(argv[ai], "-morphoutput") == 0) {
      morphoutput = std::string(argv[ai + 1]);
    } else if (strcmp(argv[ai], "-ipaoutput") == 0) {
      ipaoutput = std::string(argv[ai + 1]);
    } else if (strcmp(argv[ai], "-props") == 0) {
      propsStr = std::string(argv[ai + 1]);
      initProps(propsStr);
    } else if (strcmp(argv[ai], "-lr") == 0) {
      lr = atof(argv[ai + 1]);
    } else if (strcmp(argv[ai], "-lrUpdateRate") == 0) {
      lrUpdateRate = atoi(argv[ai + 1]);
    } else if (strcmp(argv[ai], "-dim") == 0) {
      dim = atoi(argv[ai + 1]);
    } else if (strcmp(argv[ai], "-ws") == 0) {
      ws = atoi(argv[ai + 1]);
    } else if (strcmp(argv[ai], "-epoch") == 0) {
      epoch = atoi(argv[ai + 1]);
    } else if (strcmp(argv[ai], "-minCount") == 0) {
      minCount = atoi(argv[ai + 1]);
    } else if (strcmp(argv[ai], "-neg") == 0) {
      neg = atoi(argv[ai + 1]);
    } else if (strcmp(argv[ai], "-minn") == 0) {
          minn = atoi(argv[ai + 1]);
    } else if (strcmp(argv[ai],"-maxn") == 0) {
          maxn = atoi(argv[ai + 1]);
    }else if (strcmp(argv[ai], "-wordNgrams") == 0) {
      wordNgrams = atoi(argv[ai + 1]);
    } else if (strcmp(argv[ai], "-loss") == 0) {
      if (strcmp(argv[ai + 1], "hs") == 0) {
        loss = loss_name::hs;
      } else if (strcmp(argv[ai + 1], "ns") == 0) {
        loss = loss_name::ns;
      } else if (strcmp(argv[ai + 1], "softmax") == 0) {
        loss = loss_name::softmax;
      } else {
        std::cout << "Unknown loss: " << argv[ai + 1] << std::endl;
        printHelp();
        exit(EXIT_FAILURE);
      }
    } else if (strcmp(argv[ai], "-bucket") == 0) {
      bucket = atoi(argv[ai + 1]);
    } else if (strcmp(argv[ai], "-thread") == 0) {
      thread = atoi(argv[ai + 1]);
    } else if (strcmp(argv[ai], "-t") == 0) {
      t = atof(argv[ai + 1]);
    } else if (strcmp(argv[ai], "-label") == 0) {
      label = std::string(argv[ai + 1]);
    } else if (strcmp(argv[ai], "-verbose") == 0) {
      verbose = atoi(argv[ai + 1]);
    } else if (strcmp(argv[ai], "-pretrainedVectors") == 0) {
      pretrainedVectors = std::string(argv[ai + 1]);
    } else {
      std::cout << "Unknown argument: " << argv[ai] << std::endl;
      printHelp();
      exit(EXIT_FAILURE);
    }
    ai += 2;
  }
  if (input.empty() || output.empty()) {
    std::cout << "Empty input or output path." << std::endl;
    printHelp();
    exit(EXIT_FAILURE);
  }
}